

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O1

int32_t icu_63::DayPeriodRulesDataSink::parseHour(UnicodeString *time,UErrorCode *errorCode)

{
  ushort uVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  uint uVar4;
  uint uVar5;
  char16_t cVar6;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar1 = (time->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = (uint)(short)uVar1;
  if ((short)uVar1 < 0) {
    uVar5 = (time->fUnion).fFields.fLength;
  }
  else {
    uVar5 = (int)uVar4 >> 5;
  }
  if (2 < uVar5 && (uVar5 & 0xfffffffe) == 4) {
    if ((uVar4 & 2) == 0) {
      pcVar3 = (time->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&time->fUnion + 2);
    }
    if (pcVar3[uVar5 - 3] == L':') {
      if ((uVar1 & 2) == 0) {
        pcVar3 = (time->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (char16_t *)((long)&time->fUnion + 2);
      }
      if (pcVar3[(ulong)uVar5 - 2] == L'0') {
        if ((uVar1 & 2) == 0) {
          pcVar3 = (time->fUnion).fFields.fArray;
        }
        else {
          pcVar3 = (char16_t *)((long)&time->fUnion + 2);
        }
        if (pcVar3[(ulong)uVar5 - 1] == L'0') {
          if ((uVar1 & 2) == 0) {
            pcVar3 = (time->fUnion).fFields.fArray;
          }
          else {
            pcVar3 = (time->fUnion).fStackFields.fBuffer;
          }
          if (0xfff5 < (ushort)(*pcVar3 + L'ￆ')) {
            iVar2 = (ushort)*pcVar3 - 0x30;
            if (uVar5 - 3 == 2) {
              cVar6 = L'\xffff';
              if (1 < uVar5) {
                if ((uVar4 & 2) == 0) {
                  pcVar3 = (time->fUnion).fFields.fArray;
                }
                else {
                  pcVar3 = (char16_t *)((long)&time->fUnion + 2);
                }
                cVar6 = pcVar3[1];
              }
              if (((ushort)(cVar6 + L'ￆ') < 0xfff6) ||
                 (iVar2 = (uint)(ushort)cVar6 + iVar2 * 10 + -0x30, 0x18 < iVar2))
              goto LAB_002d02b7;
            }
            return iVar2;
          }
        }
      }
    }
  }
LAB_002d02b7:
  *errorCode = U_INVALID_FORMAT_ERROR;
  return 0;
}

Assistant:

static int32_t parseHour(const UnicodeString &time, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) {
            return 0;
        }

        int32_t hourLimit = time.length() - 3;
        // `time` must look like "x:00" or "xx:00".
        // If length is wrong or `time` doesn't end with ":00", error out.
        if ((hourLimit != 1 && hourLimit != 2) ||
                time[hourLimit] != 0x3A || time[hourLimit + 1] != 0x30 ||
                time[hourLimit + 2] != 0x30) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }

        // If `time` doesn't begin with a number in [0, 24], error out.
        // Note: "24:00" is possible in "before 24:00".
        int32_t hour = time[0] - 0x30;
        if (hour < 0 || 9 < hour) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        if (hourLimit == 2) {
            int32_t hourDigit2 = time[1] - 0x30;
            if (hourDigit2 < 0 || 9 < hourDigit2) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
            hour = hour * 10 + hourDigit2;
            if (hour > 24) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
        }

        return hour;
    }